

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

int __thiscall CaDiCaL::Internal::find_conflict_level(Internal *this,int *forced)

{
  pointer *ppWVar1;
  vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_> *this_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Clause *pCVar5;
  pointer pVVar6;
  pointer pvVar7;
  pointer pWVar8;
  Clause *pCVar9;
  iterator __position;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  pointer pWVar18;
  int iVar19;
  pointer pWVar20;
  char cVar21;
  int iVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  Watch local_58;
  int *local_48;
  long local_40;
  ulong local_38;
  
  *forced = 0;
  pCVar5 = this->conflict;
  iVar19 = pCVar5->size;
  if ((long)iVar19 == 0) {
    bVar24 = false;
    iVar16 = 0;
  }
  else {
    pVVar6 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = 0;
    iVar22 = 0;
    lVar14 = 0;
    do {
      uVar2 = *(uint *)((long)&pCVar5[1].field_0 + lVar14);
      uVar4 = -uVar2;
      if (0 < (int)uVar2) {
        uVar4 = uVar2;
      }
      iVar3 = pVVar6[uVar4].level;
      if (iVar16 < iVar3) {
        *forced = uVar2;
        bVar24 = false;
        iVar16 = iVar3;
        iVar22 = 1;
      }
      else if (iVar3 == iVar16) {
        bVar24 = 0 < iVar22 && iVar16 == this->level;
        iVar22 = iVar22 + 1;
      }
      else {
        bVar24 = false;
      }
    } while ((!bVar24) && (bVar24 = (long)iVar19 * 4 + -4 != lVar14, lVar14 = lVar14 + 4, bVar24));
    bVar24 = iVar22 == 1;
  }
  uVar2 = pCVar5->size;
  local_40 = (long)(int)uVar2;
  uVar15 = 0;
  local_48 = forced;
  do {
    uVar4 = *(uint *)((long)&pCVar5[1].field_0 + uVar15 * 4);
    uVar11 = -uVar4;
    if (0 < (int)uVar4) {
      uVar11 = uVar4;
    }
    local_38 = uVar15 + 1;
    uVar12 = (uint)uVar15;
    uVar23 = uVar4;
    if ((long)local_38 < local_40) {
      pVVar6 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar19 = pVVar6[uVar11].level;
      uVar13 = uVar15 & 0xffffffff;
      uVar17 = uVar15;
      do {
        uVar12 = *(uint *)((long)&pCVar5[1].field_0 + uVar17 * 4 + 4);
        uVar10 = -uVar12;
        if (0 < (int)uVar12) {
          uVar10 = uVar12;
        }
        iVar22 = pVVar6[uVar10].level;
        cVar21 = '\v';
        if (iVar19 < iVar22) {
          cVar21 = (iVar22 == iVar16) * '\t';
          uVar13 = (ulong)((int)uVar17 + 1);
          uVar23 = uVar12;
          iVar19 = iVar22;
        }
        uVar12 = (uint)uVar13;
      } while (((cVar21 == '\v') || (cVar21 == '\0')) &&
              (uVar17 = uVar17 + 1, (ulong)uVar2 - 1 != uVar17));
    }
    if (uVar15 != uVar12) {
      if ((int)uVar12 < 2) {
        *(uint *)((long)&pCVar5[1].field_0 + (long)(int)uVar12 * 4) = uVar4;
        *(uint *)((long)&pCVar5[1].field_0 + uVar15 * 4) = uVar23;
      }
      else {
        uVar11 = uVar11 << 1 | uVar4 >> 0x1f;
        pvVar7 = (this->wtab).
                 super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pWVar18 = pvVar7[uVar11].super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pWVar8 = *(pointer *)
                  ((long)&pvVar7[uVar11].
                          super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>.
                          _M_impl.super__Vector_impl_data + 8);
        if (pWVar18 != pWVar8) {
          pCVar9 = this->conflict;
          pWVar20 = pWVar18;
          do {
            iVar19 = pWVar20->blit;
            iVar22 = pWVar20->size;
            pWVar18->clause = pWVar20->clause;
            pWVar18->blit = iVar19;
            pWVar18->size = iVar22;
            pWVar18 = pWVar18 + (pWVar18->clause != pCVar9);
            pWVar20 = pWVar20 + 1;
          } while (pWVar20 != pWVar8);
        }
        std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::resize
                  (pvVar7 + uVar11,
                   (long)pWVar18 -
                   (long)pvVar7[uVar11].
                         super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>._M_impl
                         .super__Vector_impl_data._M_start >> 4);
        *(uint *)((long)&pCVar5[1].field_0 + (ulong)uVar12 * 4) = uVar4;
        *(uint *)((long)&pCVar5[1].field_0 + uVar15 * 4) = uVar23;
        local_58.blit = *(int *)((long)&pCVar5[1].field_0 + (uVar15 & 0xffffffff ^ 1) * 4);
        uVar4 = -uVar23;
        if (0 < (int)uVar23) {
          uVar4 = uVar23;
        }
        local_58.clause = this->conflict;
        this_00 = (this->wtab).
                  super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar4 << 1 | uVar23 >> 0x1f);
        local_58.size = (local_58.clause)->size;
        __position._M_current =
             (this_00->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_00->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::
          _M_realloc_insert<CaDiCaL::Watch>(this_00,__position,&local_58);
        }
        else {
          (__position._M_current)->clause = local_58.clause;
          (__position._M_current)->blit = local_58.blit;
          (__position._M_current)->size = local_58.size;
          ppWVar1 = &(this_00->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + 1;
        }
      }
    }
    bVar25 = uVar15 == 0;
    uVar15 = local_38;
  } while (bVar25);
  if (!bVar24) {
    *local_48 = 0;
  }
  return iVar16;
}

Assistant:

inline int Internal::find_conflict_level (int &forced) {

  assert (conflict);
  assert (opts.chrono || opts.otfs || external_prop);

  int res = 0, count = 0;

  forced = 0;

  for (const auto &lit : *conflict) {
    const int tmp = var (lit).level;
    if (tmp > res) {
      res = tmp;
      forced = lit;
      count = 1;
    } else if (tmp == res) {
      count++;
      if (res == level && count > 1)
        break;
    }
  }

  LOG ("%d literals on actual conflict level %d", count, res);

  const int size = conflict->size;
  int *lits = conflict->literals;

  // Move the two highest level literals to the front.
  //
  for (int i = 0; i < 2; i++) {

    const int lit = lits[i];

    int highest_position = i;
    int highest_literal = lit;
    int highest_level = var (highest_literal).level;

    for (int j = i + 1; j < size; j++) {
      const int other = lits[j];
      const int tmp = var (other).level;
      if (highest_level >= tmp)
        continue;
      highest_literal = other;
      highest_position = j;
      highest_level = tmp;
      if (highest_level == res)
        break;
    }

    // No unwatched higher assignment level literal.
    //
    if (highest_position == i)
      continue;

    if (highest_position > 1) {
      LOG (conflict, "unwatch %d in", lit);
      remove_watch (watches (lit), conflict);
    }

    lits[highest_position] = lit;
    lits[i] = highest_literal;

    if (highest_position > 1)
      watch_literal (highest_literal, lits[!i], conflict);
  }

  // Only if the number of highest level literals in the conflict is one
  // then we can reuse the conflict clause as driving clause for 'forced'.
  //
  if (count != 1)
    forced = 0;

  return res;
}